

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pushOntoSorter(Parse *pParse,SortCtx *pSort,Select *pSelect,int regData,int regOrigData,
                   int nData,int nPrefixReg)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  VdbeOp *pVVar6;
  KeyInfo *pKVar7;
  long in_RDX;
  undefined8 *in_RSI;
  Parse *in_RDI;
  int in_R9D;
  int in_stack_00000008;
  int iCsr;
  KeyInfo *pKI;
  int nKey;
  VdbeOp *pOp;
  int addrJmp;
  int addrFirst;
  int regPrevKey;
  int iSkip;
  int iLimit;
  int op;
  int nOBSat;
  int regRecord;
  int regBase;
  int nBase;
  int nExpr;
  int bSeq;
  Vdbe *v;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  Parse *in_stack_ffffffffffffff60;
  Vdbe *p;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Vdbe *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int nExtra;
  int in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  u8 flags;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  ExprList *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_54;
  int local_44;
  
  flags = (u8)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  p = in_RDI->pVdbe;
  uVar2 = (uint)((*(byte *)((long)in_RSI + 0x24) & 1) == 0);
  iVar5 = *(int *)*in_RSI;
  local_44 = 0;
  iVar1 = *(int *)(in_RSI + 1);
  local_54 = 0;
  if (in_stack_00000008 == 0) {
    in_RDI->nMem = iVar5 + uVar2 + in_R9D + in_RDI->nMem;
  }
  if (*(int *)(in_RDX + 0xc) == 0) {
    iVar3 = *(int *)(in_RDX + 8);
  }
  else {
    iVar3 = *(int *)(in_RDX + 0xc) + 1;
  }
  nExtra = iVar3;
  iVar4 = sqlite3VdbeMakeLabel(in_RDI);
  *(int *)((long)in_RSI + 0x1c) = iVar4;
  sqlite3ExprCodeExprList
            ((Parse *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,flags);
  if (uVar2 != 0) {
    sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                      in_stack_ffffffffffffff58,0);
  }
  if ((in_stack_00000008 == 0) && (0 < in_R9D)) {
    sqlite3ExprCodeMove(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                        in_stack_ffffffffffffff58,0);
  }
  if (0 < iVar1) {
    local_44 = makeSorterRecord((Parse *)CONCAT44(in_stack_ffffffffffffff84,nExtra),
                                (SortCtx *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                (Select *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                                in_stack_ffffffffffffff68);
    in_RDI->nMem = *(int *)(in_RSI + 1) + in_RDI->nMem;
    iVar5 = (iVar5 - *(int *)(in_RSI + 1)) + uVar2;
    if (uVar2 == 0) {
      sqlite3VdbeAddOp1((Vdbe *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                        in_stack_ffffffffffffff58);
    }
    else {
      sqlite3VdbeAddOp1((Vdbe *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                        in_stack_ffffffffffffff58);
    }
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70
                      ,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    pVVar6 = sqlite3VdbeGetOp(p,*(int *)(in_RSI + 3));
    if (in_RDI->db->mallocFailed != '\0') {
      return;
    }
    pVVar6->p2 = iVar5 + in_R9D;
    pKVar7 = (pVVar6->p4).pKeyInfo;
    memset(pKVar7->aSortFlags,0,(ulong)pKVar7->nKeyField);
    sqlite3VdbeChangeP4((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,nExtra),in_stack_ffffffffffffff7c
                        ,(char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
    pKVar7 = sqlite3KeyInfoFromExprList
                       ((Parse *)CONCAT44(iVar5,in_stack_ffffffffffffff90),(ExprList *)pKVar7,
                        in_stack_ffffffffffffff84,nExtra);
    (pVVar6->p4).pKeyInfo = pKVar7;
    sqlite3VdbeCurrentAddr(p);
    sqlite3VdbeAddOp3((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                      (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70
                      ,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    iVar5 = sqlite3VdbeMakeLabel(in_RDI);
    *(int *)((long)in_RSI + 0x14) = iVar5;
    iVar5 = in_RDI->nMem + 1;
    in_RDI->nMem = iVar5;
    *(int *)(in_RSI + 2) = iVar5;
    sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                      in_stack_ffffffffffffff58,0);
    sqlite3VdbeAddOp1((Vdbe *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                      in_stack_ffffffffffffff58);
    if (iVar3 != 0) {
      sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                        in_stack_ffffffffffffff58,0);
    }
    sqlite3VdbeJumpHere((Vdbe *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    sqlite3ExprCodeMove(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                        in_stack_ffffffffffffff58,0);
    sqlite3VdbeJumpHere((Vdbe *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  if (iVar3 != 0) {
    in_stack_ffffffffffffff84 = *(int *)((long)in_RSI + 0xc);
    in_stack_ffffffffffffff70 = p;
    sqlite3VdbeCurrentAddr(p);
    sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                      in_stack_ffffffffffffff58,0);
    sqlite3VdbeAddOp2((Vdbe *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                      in_stack_ffffffffffffff58,0);
    local_54 = sqlite3VdbeAddOp4Int
                         ((Vdbe *)CONCAT44(iVar3,in_stack_ffffffffffffff78),
                          (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                          (int)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20))
    ;
    sqlite3VdbeAddOp1((Vdbe *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                      in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff7c = iVar3;
  }
  iVar5 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  if (local_44 == 0) {
    makeSorterRecord((Parse *)CONCAT44(in_stack_ffffffffffffff84,nExtra),
                     (SortCtx *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (Select *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                     in_stack_ffffffffffffff68);
  }
  sqlite3VdbeAddOp4Int
            ((Vdbe *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,iVar5);
  if (local_54 != 0) {
    if (*(int *)(in_RSI + 4) == 0) {
      iVar5 = sqlite3VdbeCurrentAddr(p);
    }
    else {
      iVar5 = *(int *)(in_RSI + 4);
    }
    sqlite3VdbeChangeP2(p,iVar5,in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

static void pushOntoSorter(
  Parse *pParse,         /* Parser context */
  SortCtx *pSort,        /* Information about the ORDER BY clause */
  Select *pSelect,       /* The whole SELECT statement */
  int regData,           /* First register holding data to be sorted */
  int regOrigData,       /* First register holding data before packing */
  int nData,             /* Number of elements in the regData data array */
  int nPrefixReg         /* No. of reg prior to regData available for use */
){
  Vdbe *v = pParse->pVdbe;                         /* Stmt under construction */
  int bSeq = ((pSort->sortFlags & SORTFLAG_UseSorter)==0);
  int nExpr = pSort->pOrderBy->nExpr;              /* No. of ORDER BY terms */
  int nBase = nExpr + bSeq + nData;                /* Fields in sorter record */
  int regBase;                                     /* Regs for sorter record */
  int regRecord = 0;                               /* Assembled sorter record */
  int nOBSat = pSort->nOBSat;                      /* ORDER BY terms to skip */
  int op;                            /* Opcode to add sorter record to sorter */
  int iLimit;                        /* LIMIT counter */
  int iSkip = 0;                     /* End of the sorter insert loop */

  assert( bSeq==0 || bSeq==1 );

  /* Three cases:
  **   (1) The data to be sorted has already been packed into a Record
  **       by a prior OP_MakeRecord.  In this case nData==1 and regData
  **       will be completely unrelated to regOrigData.
  **   (2) All output columns are included in the sort record.  In that
  **       case regData==regOrigData.
  **   (3) Some output columns are omitted from the sort record due to
  **       the SQLITE_ENABLE_SORTER_REFERENCES optimization, or due to the
  **       SQLITE_ECEL_OMITREF optimization, or due to the
  **       SortCtx.pDeferredRowLoad optimization.  In any of these cases
  **       regOrigData is 0 to prevent this routine from trying to copy
  **       values that might not yet exist.
  */
  assert( nData==1 || regData==regOrigData || regOrigData==0 );

#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  pSort->addrPush = sqlite3VdbeCurrentAddr(v);
#endif

  if( nPrefixReg ){
    assert( nPrefixReg==nExpr+bSeq );
    regBase = regData - nPrefixReg;
  }else{
    regBase = pParse->nMem + 1;
    pParse->nMem += nBase;
  }
  assert( pSelect->iOffset==0 || pSelect->iLimit!=0 );
  iLimit = pSelect->iOffset ? pSelect->iOffset+1 : pSelect->iLimit;
  pSort->labelDone = sqlite3VdbeMakeLabel(pParse);
  sqlite3ExprCodeExprList(pParse, pSort->pOrderBy, regBase, regOrigData,
                          SQLITE_ECEL_DUP | (regOrigData? SQLITE_ECEL_REF : 0));
  if( bSeq ){
    sqlite3VdbeAddOp2(v, OP_Sequence, pSort->iECursor, regBase+nExpr);
  }
  if( nPrefixReg==0 && nData>0 ){
    sqlite3ExprCodeMove(pParse, regData, regBase+nExpr+bSeq, nData);
  }
  if( nOBSat>0 ){
    int regPrevKey;   /* The first nOBSat columns of the previous row */
    int addrFirst;    /* Address of the OP_IfNot opcode */
    int addrJmp;      /* Address of the OP_Jump opcode */
    VdbeOp *pOp;      /* Opcode that opens the sorter */
    int nKey;         /* Number of sorting key columns, including OP_Sequence */
    KeyInfo *pKI;     /* Original KeyInfo on the sorter table */

    regRecord = makeSorterRecord(pParse, pSort, pSelect, regBase, nBase);
    regPrevKey = pParse->nMem+1;
    pParse->nMem += pSort->nOBSat;
    nKey = nExpr - pSort->nOBSat + bSeq;
    if( bSeq ){
      addrFirst = sqlite3VdbeAddOp1(v, OP_IfNot, regBase+nExpr);
    }else{
      addrFirst = sqlite3VdbeAddOp1(v, OP_SequenceTest, pSort->iECursor);
    }
    VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_Compare, regPrevKey, regBase, pSort->nOBSat);
    pOp = sqlite3VdbeGetOp(v, pSort->addrSortIndex);
    if( pParse->db->mallocFailed ) return;
    pOp->p2 = nKey + nData;
    pKI = pOp->p4.pKeyInfo;
    memset(pKI->aSortFlags, 0, pKI->nKeyField); /* Makes OP_Jump testable */
    sqlite3VdbeChangeP4(v, -1, (char*)pKI, P4_KEYINFO);
    testcase( pKI->nAllField > pKI->nKeyField+2 );
    pOp->p4.pKeyInfo = sqlite3KeyInfoFromExprList(pParse,pSort->pOrderBy,nOBSat,
                                           pKI->nAllField-pKI->nKeyField-1);
    pOp = 0; /* Ensure pOp not used after sqlite3VdbeAddOp3() */
    addrJmp = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp3(v, OP_Jump, addrJmp+1, 0, addrJmp+1); VdbeCoverage(v);
    pSort->labelBkOut = sqlite3VdbeMakeLabel(pParse);
    pSort->regReturn = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Gosub, pSort->regReturn, pSort->labelBkOut);
    sqlite3VdbeAddOp1(v, OP_ResetSorter, pSort->iECursor);
    if( iLimit ){
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, pSort->labelDone);
      VdbeCoverage(v);
    }
    sqlite3VdbeJumpHere(v, addrFirst);
    sqlite3ExprCodeMove(pParse, regBase, regPrevKey, pSort->nOBSat);
    sqlite3VdbeJumpHere(v, addrJmp);
  }
  if( iLimit ){
    /* At this point the values for the new sorter entry are stored
    ** in an array of registers. They need to be composed into a record
    ** and inserted into the sorter if either (a) there are currently
    ** less than LIMIT+OFFSET items or (b) the new record is smaller than
    ** the largest record currently in the sorter. If (b) is true and there
    ** are already LIMIT+OFFSET items in the sorter, delete the largest
    ** entry before inserting the new one. This way there are never more
    ** than LIMIT+OFFSET items in the sorter.
    **
    ** If the new record does not need to be inserted into the sorter,
    ** jump to the next iteration of the loop. If the pSort->labelOBLopt
    ** value is not zero, then it is a label of where to jump.  Otherwise,
    ** just bypass the row insert logic.  See the header comment on the
    ** sqlite3WhereOrderByLimitOptLabel() function for additional info.
    */
    int iCsr = pSort->iECursor;
    sqlite3VdbeAddOp2(v, OP_IfNotZero, iLimit, sqlite3VdbeCurrentAddr(v)+4);
    VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Last, iCsr, 0);
    iSkip = sqlite3VdbeAddOp4Int(v, OP_IdxLE,
                                 iCsr, 0, regBase+nOBSat, nExpr-nOBSat);
    VdbeCoverage(v);
    sqlite3VdbeAddOp1(v, OP_Delete, iCsr);
  }
  if( regRecord==0 ){
    regRecord = makeSorterRecord(pParse, pSort, pSelect, regBase, nBase);
  }
  if( pSort->sortFlags & SORTFLAG_UseSorter ){
    op = OP_SorterInsert;
  }else{
    op = OP_IdxInsert;
  }
  sqlite3VdbeAddOp4Int(v, op, pSort->iECursor, regRecord,
                       regBase+nOBSat, nBase-nOBSat);
  if( iSkip ){
    sqlite3VdbeChangeP2(v, iSkip,
         pSort->labelOBLopt ? pSort->labelOBLopt : sqlite3VdbeCurrentAddr(v));
  }
#ifdef SQLITE_ENABLE_STMT_SCANSTATUS
  pSort->addrPushEnd = sqlite3VdbeCurrentAddr(v)-1;
#endif
}